

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O2

void __thiscall diy::Master::unload(Master *this,vector<int,_std::allocator<int>_> *loaded)

{
  pointer piVar1;
  pointer piVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    piVar1 = (loaded->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar2 = (loaded->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    if ((ulong)((long)piVar2 - (long)piVar1 >> 2) <= (ulong)uVar3) break;
    unload(this,piVar1[uVar3]);
    uVar3 = uVar3 + 1;
  }
  if (piVar2 != piVar1) {
    (loaded->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  return;
}

Assistant:

void          unload(std::vector<int>& loaded)    { for(unsigned i = 0; i < loaded.size(); ++i) unload(loaded[i]); loaded.clear(); }